

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  size_t __n;
  char *__dest;
  int iVar5;
  int iVar6;
  
  pIVar4 = GImGui;
  pcVar2 = (GImGui->PrivateClipboard).Data;
  if (pcVar2 != (char *)0x0) {
    (pIVar4->PrivateClipboard).Size = 0;
    (pIVar4->PrivateClipboard).Capacity = 0;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (pIVar4->PrivateClipboard).Data = (char *)0x0;
  }
  __n = strlen(text);
  uVar3 = (uint)__n;
  iVar5 = uVar3 + 1;
  iVar1 = (pIVar4->PrivateClipboard).Capacity;
  if (iVar1 <= (int)uVar3) {
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
      pcVar2 = (pIVar4->PrivateClipboard).Data;
      if (pcVar2 != (char *)0x0) {
        memcpy(__dest,pcVar2,(long)(pIVar4->PrivateClipboard).Size);
        pcVar2 = (pIVar4->PrivateClipboard).Data;
        if (pcVar2 != (char *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      }
      (pIVar4->PrivateClipboard).Data = __dest;
      (pIVar4->PrivateClipboard).Capacity = iVar6;
    }
  }
  (pIVar4->PrivateClipboard).Size = iVar5;
  if (-1 < (int)uVar3) {
    memcpy((pIVar4->PrivateClipboard).Data,text,__n);
    if ((int)uVar3 < (pIVar4->PrivateClipboard).Size) {
      (pIVar4->PrivateClipboard).Data[uVar3 & 0x7fffffff] = '\0';
      return;
    }
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4c0,"value_type &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}